

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O2

int maph(int argc,char **argv)

{
  int ny;
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long local_510;
  ulong local_500;
  vector<unsigned_int,_std::allocator<unsigned_int>_> img;
  json inj;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> idx;
  string fjson;
  vector<unsigned_int,_std::allocator<unsigned_int>_> kernel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  string local_408;
  string local_3e8;
  Transformation t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  Data d;
  Settings s;
  
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 0x10;
  Settings::Settings(&s);
  t.outdir._M_dataplus._M_p = (pointer)&t.outdir.field_2;
  t.mat.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  t.mat.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  t.mat.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  t.outdir._M_string_length = 0;
  t.outdir.field_2._M_local_buf[0] = '\0';
  memset(&d,0,0x90);
  fjson._M_dataplus._M_p = (pointer)&fjson.field_2;
  fjson._M_string_length = 0;
  fjson.field_2._M_local_buf[0] = '\0';
  iVar1 = loadArgs(argc,argv,&s,&t,&fjson);
  if (iVar1 == 0) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&inj,(nullptr_t)0x0);
    iVar1 = loadJson(&fjson,&inj);
    if (iVar1 == 0) {
      iVar1 = loadSettings(&s,&inj,&fjson);
      if (iVar1 == 0) {
        getFiles(&s.fgpx,&d.gpxs);
        poVar3 = std::operator<<((ostream *)&std::cout,"Number of GPX files = ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::endl<char,std::char_traits<char>>(poVar3);
        setTransformation(&t);
        iVar1 = loadGpxs(&s,&t,&d);
        if (iVar1 == 0) {
          iVar1 = 0;
          if (t.enable == false) {
            setFitting(&s,&d);
            getKernel(&kernel,&s);
            convolute(&img,&s,&d,&kernel);
            irwincolor::sortidx<unsigned_int>(&idx,&img);
            if (s.allCmaps == true) {
              local_500 = 0xffffffffffffffff;
              iVar1 = 0;
              local_510 = 0;
              do {
                local_500 = local_500 + 1;
                if ((ulong)((long)s.mapNames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)s.mapNames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) <= local_500)
                goto LAB_0010b8ca;
                std::__cxx11::string::string((string *)&local_3e8,(string *)&s.cmapFile);
                std::__cxx11::string::string
                          ((string *)&local_408,
                           (string *)
                           ((long)&((s.mapNames.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           local_510));
                iVar2 = irwincolor::Map::load(&s.c,&local_3e8,&local_408);
                std::__cxx11::string::~string((string *)&local_408);
                std::__cxx11::string::~string((string *)&local_3e8);
                if (iVar2 != 0) break;
                colorPixels(&pixels,&s,&img,&idx);
                ny = s.ny;
                iVar2 = s.nx;
                std::operator+(&local_428,&s.fname,&s.dlm);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &pixels_1,&local_428,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&((s.mapNames.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + local_510));
                std::operator+(&local_370,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &pixels_1,&s.imgext);
                iVar2 = irwincolor::savePng((vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )&pixels.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ,iVar2,ny,&local_370);
                local_510 = local_510 + 0x20;
                std::__cxx11::string::~string((string *)&local_370);
                std::__cxx11::string::~string((string *)&pixels_1);
                std::__cxx11::string::~string((string *)&local_428);
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          (&pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          );
              } while (iVar2 == 0);
              iVar1 = 1;
            }
            else {
              colorPixels(&pixels_1,&s,&img,&idx);
              std::operator+(&local_460,&s.fname,&s.imgext);
              iVar1 = irwincolor::savePng(&pixels_1,s.nx,s.ny,&local_460);
              std::__cxx11::string::~string((string *)&local_460);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&pixels_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        );
            }
LAB_0010b8ca:
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&img.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&kernel.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          }
        }
        else {
          iVar1 = 1;
        }
      }
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&inj);
  }
  else {
    iVar1 = -1;
  }
  std::__cxx11::string::~string((string *)&fjson);
  Data::~Data(&d);
  Transformation::~Transformation(&t);
  Settings::~Settings(&s);
  return iVar1;
}

Assistant:

int maph(int argc, char* argv[])
{
	int io = 0;

	std::cout << std::setprecision(16);

	Settings s;
	Transformation t;
	Data d;
	std::string fjson;

	io = loadArgs(argc, argv, s, t, fjson);
	if (io != 0)
		return io;

	json inj;
	io = loadJson(fjson, inj);
	if (io != 0)
		return io;

	io = loadSettings(s, inj, fjson);
	if (io != 0)
		return io;

	getFiles(s.fgpx, d.gpxs);

	//std::cout << "GPX files = " << d.gpxs << std::endl;
	std::cout << "Number of GPX files = " << d.gpxs.size() << std::endl;

	setTransformation(t);

	io = loadGpxs(s, t, d);
	if (io != 0)
		return io;

	if (t.enable)
		return 0;

	setFitting(s, d);
	auto kernel = getKernel(s);
	auto img = convolute(s, d, kernel);
	//return 0;  // for benchmarking kernel convolution

	// Sort for histogram coloring.
	auto idx = irwincolor::sortidx(img);

	if (s.allCmaps)
	{
		for (int i = 0; i < s.mapNames.size(); i++)
		{
			if (io = s.c.load(s.cmapFile, s.mapNames[i]) != 0)
				return io;
			auto pixels = colorPixels(s, img, idx);
			if (io = irwincolor::savePng(pixels, s.nx, s.ny,
					s.fname + s.dlm + s.mapNames[i] + s.imgext)
					!= 0)
				return io;
		}
	}
	else
	{
		auto pixels = colorPixels(s, img, idx);
		io = irwincolor::savePng(pixels, s.nx, s.ny, s.fname + s.imgext);
	}

	return io;
}